

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permutations.h
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
wasm::makeIdentity(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
                  Index num)

{
  pointer puVar1;
  Index i;
  ulong uVar2;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (__return_storage_ptr__,(ulong)num);
  puVar1 = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar2 = 0; num != uVar2; uVar2 = uVar2 + 1) {
    puVar1[uVar2] = (uint)uVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<Index> makeIdentity(Index num) {
  std::vector<Index> ret;
  ret.resize(num);
  for (Index i = 0; i < num; i++) {
    ret[i] = i;
  }
  return ret;
}